

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_word.cpp
# Opt level: O2

wstring * __thiscall BmsWord::ToWString_abi_cxx11_(wstring *__return_storage_ptr__,BmsWord *this)

{
  string s;
  string local_30;
  
  ToString_abi_cxx11_(&local_30,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((wstring *)__return_storage_ptr__,local_30._M_dataplus._M_p,
             local_30._M_dataplus._M_p + local_30._M_string_length);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::wstring
BmsWord::ToWString(void) const
{
	std::string s = ToString();
	return std::wstring(s.begin(), s.end());
}